

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.h
# Opt level: O2

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* GetStringTokens(vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *__return_storage_ptr__,string_view *signature)

{
  byte bVar1;
  bool bVar2;
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *this;
  ostream *poVar3;
  ulong __pos;
  long lVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *local_40;
  string_view *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar4 = 0;
  __pos = 0;
  bVar2 = false;
  local_40 = (vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              *)__return_storage_ptr__;
  local_38 = signature;
  do {
    bVar1 = local_38->_M_str[lVar4];
    if (bVar2) {
      bVar2 = false;
      if (((bVar1 - 99 < 0x11) && ((0x1004bU >> (bVar1 - 99 & 0x1f) & 1) != 0)) || (bVar1 == 0)) {
        poVar3 = std::operator<<((ostream *)&std::cout,bVar1);
        poVar3 = std::operator<<(poVar3," found after % at ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,", making substr(");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,")");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"substr = ");
        bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (local_38,__pos,~__pos + lVar4);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,bVar5._M_str,bVar5._M_len);
        std::endl<char,std::char_traits<char>>(poVar3);
        local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (local_38,__pos,~__pos + lVar4);
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>(local_40,&local_50);
        __pos = lVar4 + 1;
        bVar2 = false;
      }
    }
    else if (bVar1 == 0x25) {
      poVar3 = std::operator<<((ostream *)&std::cout,"% found at ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      bVar2 = true;
    }
    else {
      bVar2 = false;
      if (bVar1 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"str ends at ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,", making substr(");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,")");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"substr = ");
        bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (local_38,__pos,lVar4 - __pos);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,bVar5._M_str,bVar5._M_len);
        std::endl<char,std::char_traits<char>>(poVar3);
        this = local_40;
        local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (local_38,__pos,lVar4 - __pos);
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>(this,&local_50);
        return (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)this;
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

std::vector<std::string_view> GetStringTokens(const std::string_view& signature) {
    std::vector<std::string_view> token_vector;
    _tokenizer_state state = TNORMAL;
    size_t idx_start = 0, idx = 0;
    while (true) {
        if (state == TNORMAL) {
            if (signature[idx] == '%') {
                std::cout << "% found at " << idx << std::endl;
                state = TPERC;
            } else if (signature[idx] == '\0') {
                std::cout << "str ends at " << idx;
                std::cout << ", making substr(" << idx_start << ", " << idx - idx_start << ")" << std::endl;
                std::cout << "substr = " << signature.substr(idx_start, idx - idx_start) << std::endl;
                token_vector.emplace_back(signature.substr(idx_start, idx - idx_start));
                break;
            }
            ++idx;
        } else {
            state = TNORMAL;
            switch (signature[idx]) {
            case 's':
            case 'c':
            case 'i':
            case 'd':
            case 'f':
            case '\0':
                std::cout << signature[idx] << " found after % at " << idx;
                std::cout << ", making substr(" << idx_start << ", " << idx - idx_start - 1 << ")" << std::endl;
                std::cout << "substr = " << signature.substr(idx_start, idx - idx_start - 1) << std::endl;
                token_vector.emplace_back(signature.substr(idx_start, idx - idx_start - 1));
                idx_start = idx + 1;
                break;
            default:
                break;
            }
            ++idx;
        }
    }

    return token_vector;
}